

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

ElementSegment * __thiscall
wasm::Module::addElementSegment
          (Module *this,
          unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr)

{
  ElementSegment *pEVar1;
  string local_40;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> local_20;
  
  local_20._M_head_impl =
       (curr->_M_t).
       super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
       super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
       super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
  (curr->_M_t).
  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
  super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = (ElementSegment *)0x0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"addElementSegment","");
  pEVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>,std::unordered_map<wasm::Name,wasm::ElementSegment*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::ElementSegment*>>>,wasm::ElementSegment>
                     (&this->elementSegments,&this->elementSegmentsMap,
                      (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       *)&local_20,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_20._M_head_impl != (ElementSegment *)0x0) {
    std::default_delete<wasm::ElementSegment>::operator()
              ((default_delete<wasm::ElementSegment> *)&local_20,local_20._M_head_impl);
  }
  return pEVar1;
}

Assistant:

ElementSegment*
Module::addElementSegment(std::unique_ptr<ElementSegment>&& curr) {
  return addModuleElement(
    elementSegments, elementSegmentsMap, std::move(curr), "addElementSegment");
}